

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O1

int32 accum_global(model_inventory_t *inv,state_t *state,uint32 n_state,int32 mixw_reest,
                  int32 tmat_reest,int32 mean_reest,int32 var_reest,int32 var_is_full)

{
  gauden_t *g;
  
  g = inv->gauden;
  if (mixw_reest != 0) {
    accum_global_mixw(inv,g);
  }
  if (tmat_reest != 0) {
    accum_global_tmat(inv,state,n_state);
  }
  if (mean_reest != 0) {
    accum_global_gauden(g->macc,g->l_macc,g,inv->cb_inverse,inv->n_cb_inverse);
  }
  if (var_reest != 0) {
    if (var_is_full == 0) {
      accum_global_gauden(g->vacc,g->l_vacc,g,inv->cb_inverse,inv->n_cb_inverse);
    }
    else {
      accum_global_gauden_full(g->fullvacc,g->l_fullvacc,g,inv->cb_inverse,inv->n_cb_inverse);
    }
  }
  if (var_reest != 0 || mean_reest != 0) {
    accum_global_gauden_dnom(g->dnom,g->l_dnom,g,inv->cb_inverse,inv->n_cb_inverse);
  }
  return 0;
}

Assistant:

int32
accum_global(model_inventory_t *inv,
	     state_t *state,
	     uint32 n_state,
	     int32 mixw_reest,
	     int32 tmat_reest,
	     int32 mean_reest,
	     int32 var_reest,
	     int32 var_is_full)
{
    gauden_t *g;

    g = inv->gauden;

    if (mixw_reest) {
	/* add local mixing weight accumulators to global ones */
	accum_global_mixw(inv, g);
    }

    if (tmat_reest) {
	/* add local transition probability matrix accumulators to global ones */
	accum_global_tmat(inv, state, n_state);
    }

    if (mean_reest) {
	/* add local mean accumulators to global ones */
	accum_global_gauden(g->macc, g->l_macc, g,
			    inv->cb_inverse, inv->n_cb_inverse);
    }
    if (var_reest) {
	/* add local variance accumulators to global ones */
	if (var_is_full)
	    accum_global_gauden_full(g->fullvacc, g->l_fullvacc, g,
				     inv->cb_inverse, inv->n_cb_inverse);
	else
	    accum_global_gauden(g->vacc, g->l_vacc, g,
				inv->cb_inverse, inv->n_cb_inverse);
    }
    if (mean_reest || var_reest) {
	/* add local mean/variance denominator accumulators to global ones */
	accum_global_gauden_dnom(g->dnom, g->l_dnom, g,
				 inv->cb_inverse, inv->n_cb_inverse);
    }
    
    return S3_SUCCESS;
}